

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwebp.c
# Opt level: O0

int ReadYUV(uint8_t *data,size_t data_size,WebPPicture *pic)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int src_stride;
  uint uVar4;
  int iVar5;
  uint8_t *dst;
  int *in_RDX;
  uint8_t *in_RSI;
  size_t expected_data_size;
  int uv_plane_size;
  int y_plane_size;
  int uv_height;
  int uv_width;
  int use_argb;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_4;
  
  iVar1 = *in_RDX;
  iVar2 = (in_RDX[3] + 1) / 2;
  iVar3 = in_RDX[2] * in_RDX[3];
  src_stride = ((in_RDX[2] + 1) / 2) * iVar2;
  uVar4 = iVar3 + src_stride * 2;
  dst = (uint8_t *)(long)(int)uVar4;
  if (in_RSI == dst) {
    *in_RDX = 0;
    iVar5 = WebPPictureAlloc((WebPPicture *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (iVar5 == 0) {
      local_4 = 0;
    }
    else {
      ImgIoUtilCopyPlane((uint8_t *)CONCAT44(iVar2,iVar3),src_stride,dst,in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffb8,0);
      ImgIoUtilCopyPlane((uint8_t *)CONCAT44(iVar2,iVar3),src_stride,dst,in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffb8,0);
      ImgIoUtilCopyPlane((uint8_t *)CONCAT44(iVar2,iVar3),src_stride,dst,in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffb8,0);
      if (iVar1 == 0) {
        local_4 = 1;
      }
      else {
        local_4 = WebPPictureYUVAToARGB((WebPPicture *)data_size);
      }
    }
  }
  else {
    fprintf(stderr,"input data doesn\'t have the expected size (%d instead of %d)\n",
            (ulong)in_RSI & 0xffffffff,(ulong)uVar4);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ReadYUV(const uint8_t* const data, size_t data_size,
                   WebPPicture* const pic) {
  const int use_argb = pic->use_argb;
  const int uv_width = (pic->width + 1) / 2;
  const int uv_height = (pic->height + 1) / 2;
  const int y_plane_size = pic->width * pic->height;
  const int uv_plane_size = uv_width * uv_height;
  const size_t expected_data_size = y_plane_size + 2 * uv_plane_size;

  if (data_size != expected_data_size) {
    fprintf(stderr,
            "input data doesn't have the expected size (%d instead of %d)\n",
            (int)data_size, (int)expected_data_size);
    return 0;
  }

  pic->use_argb = 0;
  if (!WebPPictureAlloc(pic)) return 0;
  ImgIoUtilCopyPlane(data, pic->width, pic->y, pic->y_stride,
                     pic->width, pic->height);
  ImgIoUtilCopyPlane(data + y_plane_size, uv_width,
                     pic->u, pic->uv_stride, uv_width, uv_height);
  ImgIoUtilCopyPlane(data + y_plane_size + uv_plane_size, uv_width,
                     pic->v, pic->uv_stride, uv_width, uv_height);
  return use_argb ? WebPPictureYUVAToARGB(pic) : 1;
}